

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestAds::testAdsReadWriteReqEx2(TestAds *this,string *param_1)

{
  long lVar1;
  ostream *poVar2;
  bool bVar3;
  bool bVar4;
  test_root local_440;
  test_root local_420;
  test_root local_400;
  test_root local_3e0;
  test_root local_3c0;
  test_root local_3a0;
  test_root local_380;
  test_root local_360;
  test_root local_340;
  test_root local_320;
  test_root local_300;
  test_root local_2e0;
  test_root local_2c0;
  test_root local_2a0;
  test_root local_280;
  test_root local_260;
  test_root local_240;
  test_root local_220;
  test_root local_200;
  AmsNetId local_1e0 [6];
  undefined2 local_1da;
  AmsAddr unknown;
  test_root local_1b8;
  test_root local_198;
  test_root local_178;
  test_root local_158;
  test_root local_138;
  test_root local_118;
  test_root local_f8;
  test_root local_d8;
  int local_b4;
  uint local_b0;
  int i;
  uint32_t outBuffer;
  uint32_t buffer;
  test_root local_88;
  uint local_64;
  uint local_60;
  uint32_t bytesRead;
  uint32_t hHandle;
  test_root local_50;
  long local_30;
  long port;
  char handleName [12];
  string *param_1_local;
  TestAds *this_local;
  
  port = 0x4279622e4e49414d;
  builtin_strncpy(handleName,"yte",4);
  unique0x10001315 = param_1;
  local_30 = AdsPortOpenEx();
  bVar3 = local_30 != 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_50);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_50,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1db);
  std::__cxx11::string::~string((string *)&local_50);
  lVar1 = AdsSyncReadWriteReqEx2
                    (local_30,(AmsAddr *)&server,0xf003,0,4,&local_60,0xc,&port,&local_64);
  fructose::test_root::get_test_name_abi_cxx11_(&local_88);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_88,
             "0 == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(hHandle), &hHandle, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1e2);
  std::__cxx11::string::~string((string *)&local_88);
  bVar3 = local_64 == 4;
  fructose::test_root::get_test_name_abi_cxx11_((test_root *)&outBuffer);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&outBuffer,"sizeof(hHandle) == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1e3);
  std::__cxx11::string::~string((string *)&outBuffer);
  local_60 = bhf::ads::letoh<unsigned_int>(&local_60);
  local_b0 = 0xdeadbeef;
  for (local_b4 = 0; local_b4 < 10; local_b4 = local_b4 + 1) {
    fructose::test_root::set_assertion_tested((test_root *)this);
    lVar1 = AdsSyncWriteReqEx(local_30,(AmsAddr *)&server,0xf005,local_60,4,&local_b0);
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if ((lVar1 == 0) == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_b4);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_d8);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_d8,
                 "0 == AdsSyncWriteReqEx(port, &server, 0xF005, hHandle, sizeof(outBuffer), &outBuffer)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x1ee);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    fructose::test_root::set_assertion_tested((test_root *)this);
    lVar1 = AdsSyncReadReqEx2(local_30,(AmsAddr *)&server,0xf005,local_60,4,&i,&local_64);
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if ((lVar1 == 0) == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_b4);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_f8);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_f8,
                 "0 == AdsSyncReadReqEx2(port, &server, 0xF005, hHandle, sizeof(buffer), &buffer, &bytesRead)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x1f2);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    fructose::test_root::set_assertion_tested((test_root *)this);
    bVar4 = local_64 == 4;
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if (bVar4 == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_b4);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_118);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_118,"sizeof(buffer) == bytesRead",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,499);
      std::__cxx11::string::~string((string *)&local_118);
    }
    fructose::test_root::set_assertion_tested((test_root *)this);
    bVar4 = local_b0 == i;
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if (bVar4 == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_b4);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_138);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_138,"outBuffer == buffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,500);
      std::__cxx11::string::~string((string *)&local_138);
    }
    local_b0 = local_b0 ^ 0xffffffff;
  }
  local_60 = bhf::ads::htole<unsigned_int>(local_60);
  lVar1 = AdsSyncWriteReqEx(local_30,(AmsAddr *)&server,0xf006,0,4,&local_60);
  fructose::test_root::get_test_name_abi_cxx11_(&local_158);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_158,
             "0 == AdsSyncWriteReqEx(port, &server, 0xF006, 0, sizeof(hHandle), &hHandle)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x1f8);
  std::__cxx11::string::~string((string *)&local_158);
  local_64 = 0xdeadbeef;
  lVar1 = AdsSyncReadWriteReqEx2(0,(AmsAddr *)&server,0xf003,0,4,&i,0xc,&port,&local_64);
  fructose::test_root::get_test_name_abi_cxx11_(&local_178);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x748,(string *)&local_178,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncReadWriteReqEx2(0, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x1ff);
  std::__cxx11::string::~string((string *)&local_178);
  bVar3 = local_64 == 0xdeadbeef;
  fructose::test_root::get_test_name_abi_cxx11_(&local_198);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_198,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x200);
  std::__cxx11::string::~string((string *)&local_198);
  local_64 = 0xdeadbeef;
  lVar1 = AdsSyncReadWriteReqEx2(local_30,(AmsAddr *)0x0,0xf003,0,4,&i,0xc,&port,&local_64);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1b8);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x749,(string *)&local_1b8,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncReadWriteReqEx2(port, nullptr, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x207);
  std::__cxx11::string::~string((string *)&local_1b8);
  bVar3 = local_64 == 0xdeadbeef;
  fructose::test_root::get_test_name_abi_cxx11_((test_root *)&unknown);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&unknown,"0xDEADBEEF == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x208);
  std::__cxx11::string::~string((string *)&unknown);
  local_64 = 0xdeadbeef;
  AmsNetId::AmsNetId(local_1e0,'\x01','\x02','\x03','\x04','\x05','\x06');
  local_1da = 0x353;
  lVar1 = AdsSyncReadWriteReqEx2(local_30,(AmsAddr *)local_1e0,0xf003,0,4,&i,0xc,&port,&local_64);
  fructose::test_root::get_test_name_abi_cxx11_(&local_200);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 7,(string *)&local_200,
             "GLOBALERR_MISSING_ROUTE == AdsSyncReadWriteReqEx2(port, &unknown, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x210);
  std::__cxx11::string::~string((string *)&local_200);
  bVar3 = local_64 == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_220);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_220,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x211);
  std::__cxx11::string::~string((string *)&local_220);
  i = -0x21524111;
  lVar1 = AdsSyncReadWriteReqEx2(local_30,(AmsAddr *)&server,0xf003,0,4,&i,0xc,&port,(uint *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_240);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_240,
             "0 == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x218);
  std::__cxx11::string::~string((string *)&local_240);
  bVar3 = i != -0x21524111;
  fructose::test_root::get_test_name_abi_cxx11_(&local_260);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_260,"0xDEADBEEF != buffer",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x219);
  std::__cxx11::string::~string((string *)&local_260);
  lVar1 = AdsSyncReadWriteReqEx2
                    (local_30,(AmsAddr *)&server,0xf003,0,4,(void *)0x0,0xc,&port,(uint *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_280);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_280,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName), handleName, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x21f);
  std::__cxx11::string::~string((string *)&local_280);
  lVar1 = AdsSyncReadWriteReqEx2
                    (local_30,(AmsAddr *)&server,0xf003,0,4,(void *)0x0,0xc,&port,&local_64);
  fructose::test_root::get_test_name_abi_cxx11_(&local_2a0);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_2a0,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x223);
  std::__cxx11::string::~string((string *)&local_2a0);
  local_64 = 0xdeadbeef;
  lVar1 = AdsSyncReadWriteReqEx2(local_30,(AmsAddr *)&server,0xf003,0,0,&i,0xc,&port,&local_64);
  fructose::test_root::get_test_name_abi_cxx11_(&local_2c0);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x705,(string *)&local_2c0,
             "ADSERR_DEVICE_INVALIDSIZE == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, 0, &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x229);
  std::__cxx11::string::~string((string *)&local_2c0);
  bVar3 = local_64 == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_2e0);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_2e0,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x22a);
  std::__cxx11::string::~string((string *)&local_2e0);
  lVar1 = AdsSyncReadWriteReqEx2
                    (local_30,(AmsAddr *)&server,0xf003,0,4,&i,0xc,(void *)0x0,(uint *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_300);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_300,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), nullptr, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x230);
  std::__cxx11::string::~string((string *)&local_300);
  lVar1 = AdsSyncReadWriteReqEx2
                    (local_30,(AmsAddr *)&server,0xf003,0,4,&i,0xc,(void *)0x0,&local_64);
  fructose::test_root::get_test_name_abi_cxx11_(&local_320);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_320,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName), nullptr, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x234);
  std::__cxx11::string::~string((string *)&local_320);
  local_64 = 0xdeadbeef;
  lVar1 = AdsSyncReadWriteReqEx2(local_30,(AmsAddr *)&server,0xf003,0,4,&i,0,&port,&local_64);
  fructose::test_root::get_test_name_abi_cxx11_(&local_340);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x710,(string *)&local_340,
             "ADSERR_DEVICE_SYMBOLNOTFOUND == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 0, handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x23a);
  std::__cxx11::string::~string((string *)&local_340);
  bVar3 = local_64 == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_360);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_360,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x23b);
  std::__cxx11::string::~string((string *)&local_360);
  local_64 = 0xdeadbeef;
  lVar1 = AdsSyncReadWriteReqEx2(local_30,(AmsAddr *)&server,0xf003,0,4,&i,3,"xxx",&local_64);
  fructose::test_root::get_test_name_abi_cxx11_(&local_380);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x710,(string *)&local_380,
             "ADSERR_DEVICE_SYMBOLNOTFOUND == AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 3, \"xxx\", &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x241);
  std::__cxx11::string::~string((string *)&local_380);
  bVar3 = local_64 == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_3a0);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_3a0,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x242);
  std::__cxx11::string::~string((string *)&local_3a0);
  local_64 = 0xdeadbeef;
  lVar1 = AdsSyncReadWriteReqEx2(local_30,(AmsAddr *)&server,0,0,4,&i,0xc,&port,&local_64);
  fructose::test_root::get_test_name_abi_cxx11_(&local_3c0);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x701,(string *)&local_3c0,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadWriteReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x249);
  std::__cxx11::string::~string((string *)&local_3c0);
  bVar3 = local_64 == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_3e0);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_3e0,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x24a);
  std::__cxx11::string::~string((string *)&local_3e0);
  local_64 = 0xdeadbeef;
  lVar1 = AdsSyncReadWriteReqEx2
                    (local_30,(AmsAddr *)&server,0x4025,0x10000,4,&i,0xc,&port,&local_64);
  fructose::test_root::get_test_name_abi_cxx11_(&local_400);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x701,(string *)&local_400,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncReadWriteReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer, sizeof(handleName), handleName, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x251);
  std::__cxx11::string::~string((string *)&local_400);
  bVar3 = local_64 == 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_420);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_420,"0 == bytesRead",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x252);
  std::__cxx11::string::~string((string *)&local_420);
  lVar1 = AdsPortCloseEx(local_30);
  fructose::test_root::get_test_name_abi_cxx11_(&local_440);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_440,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x253);
  std::__cxx11::string::~string((string *)&local_440);
  return;
}

Assistant:

void testAdsReadWriteReqEx2(const std::string&)
    {
        char handleName[] = "MAIN.byByte";
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        uint32_t hHandle;
        uint32_t bytesRead;
        fructose_assert(0 ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(hHandle), &hHandle, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(sizeof(hHandle) == bytesRead);
        hHandle = bhf::ads::letoh(hHandle);

        uint32_t buffer;
        uint32_t outBuffer = 0xDEADBEEF;
        for (int i = 0; i < NUM_TEST_LOOPS; ++i) {
            fructose_loop_assert(i, 0 == AdsSyncWriteReqEx(port,
                                                           &server,
                                                           0xF005,
                                                           hHandle,
                                                           sizeof(outBuffer),
                                                           &outBuffer));
            fructose_loop_assert(i,
                                 0 ==
                                 AdsSyncReadReqEx2(port, &server, 0xF005, hHandle, sizeof(buffer), &buffer,
                                                   &bytesRead));
            fructose_loop_assert(i, sizeof(buffer) == bytesRead);
            fructose_loop_assert(i, outBuffer == buffer);
            outBuffer = ~outBuffer;
        }
        hHandle = bhf::ads::htole(hHandle);
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0xF006, 0, sizeof(hHandle), &hHandle));

        // provide out of range port
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncReadWriteReqEx2(0, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide nullptr to AmsAddr
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncReadWriteReqEx2(port, nullptr, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0xDEADBEEF == bytesRead); // BUG? TcAdsDll doesn't reset bytesRead!

        // provide unknown AmsAddr
        bytesRead = 0xDEADBEEF;
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncReadWriteReqEx2(port, &unknown, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide nullptr to bytesRead
        buffer = 0xDEADBEEF;
        fructose_assert(0 ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               nullptr));
        fructose_assert(0xDEADBEEF != buffer);

        // provide nullptr to readBuffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName),
                                               handleName,
                                               nullptr));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), nullptr, sizeof(handleName),
                                               handleName,
                                               &bytesRead));

        // provide 0 length readBuffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_INVALIDSIZE ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, 0, &buffer, sizeof(handleName), handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide nullptr to writeBuffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               nullptr,
                                               nullptr));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               nullptr,
                                               &bytesRead));

        // provide 0 length writeBuffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SYMBOLNOTFOUND ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 0, handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid writeBuffer
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SYMBOLNOTFOUND ==
                        AdsSyncReadWriteReqEx2(port, &server, 0xF003, 0, sizeof(buffer), &buffer, 3, "xxx",
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid indexGroup
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadWriteReqEx2(port, &server, 0, 0, sizeof(buffer), &buffer, sizeof(handleName),
                                               handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);

        // provide invalid indexOffset
        bytesRead = 0xDEADBEEF;
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncReadWriteReqEx2(port, &server, 0x4025, 0x10000, sizeof(buffer), &buffer,
                                               sizeof(handleName), handleName,
                                               &bytesRead));
        fructose_assert(0 == bytesRead);
        fructose_assert(0 == AdsPortCloseEx(port));
    }